

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_text_read::TextReader::read_hash_name(TextReader *this,FNV1a *value)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  string str;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = this->cur_;
  bVar2 = read_hash(this,value);
  bVar3 = true;
  if (!bVar2) {
    this->cur_ = pcVar1;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    bVar3 = read_name(this,&local_60);
    if (bVar3) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      read_hash_name();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool read_hash_name(FNV1a& value) noexcept {
            auto const backup = cur_;
            if (read_hash(value)) {
                return true;
            }
            cur_ = backup;
            if (std::string str; read_name(str)) {
                value = { str };
                return true;
            }
            return false;
        }